

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS ref_metric_circle_node(REF_NODE ref_node)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  double local_f8;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL m [6];
  REF_DBL d [12];
  REF_DBL h2;
  REF_DBL h1;
  REF_DBL hy;
  REF_DBL t;
  REF_DBL r;
  REF_DBL z;
  REF_DBL x;
  REF_INT node;
  REF_NODE ref_node_local;
  
  x._4_4_ = 0;
  do {
    if (ref_node->max <= x._4_4_) {
      return 0;
    }
    if (((-1 < x._4_4_) && (x._4_4_ < ref_node->max)) && (-1 < ref_node->global[x._4_4_])) {
      dVar2 = ref_node->real[x._4_4_ * 0xf];
      dVar3 = ref_node->real[x._4_4_ * 0xf + 2];
      local_f8 = sqrt(dVar2 * dVar2 + dVar3 * dVar3);
      dVar2 = atan2(dVar3,dVar2);
      if (1.0 - local_f8 <= 0.0) {
        local_f8 = -(1.0 - local_f8);
      }
      else {
        local_f8 = 1.0 - local_f8;
      }
      dVar3 = local_f8 * 1.5 + 0.0005;
      m[5] = 1.0 / (dVar3 * dVar3);
      cos(dVar2);
      sin(dVar2);
      sin(dVar2);
      cos(dVar2);
      ref_matrix_form_m(m + 5,(REF_DBL *)&stack0xffffffffffffff18);
      uVar1 = ref_node_metric_set(ref_node,x._4_4_,(REF_DBL *)&stack0xffffffffffffff18);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0x181,"ref_metric_circle_node",(ulong)uVar1,"set node met");
        return uVar1;
      }
    }
    x._4_4_ = x._4_4_ + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_circle_node(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL x, z, r, t;
  REF_DBL hy, h1, h2;
  REF_DBL d[12], m[6];

  each_ref_node_valid_node(ref_node, node) {
    x = ref_node_xyz(ref_node, 0, node);
    z = ref_node_xyz(ref_node, 2, node);
    r = sqrt(x * x + z * z);
    t = atan2(z, x);
    hy = 1.0;
    h1 = 0.0005 + 1.5 * ABS(1.0 - r);
    h2 = 0.1 * r + 1.5 * ABS(1.0 - r);
    ref_matrix_eig(d, 0) = 1.0 / (h1 * h1);
    ref_matrix_eig(d, 1) = 1.0 / (h2 * h2);
    ref_matrix_eig(d, 2) = 1.0 / (hy * hy);
    ref_matrix_vec(d, 0, 0) = cos(t);
    ref_matrix_vec(d, 1, 0) = 0.0;
    ref_matrix_vec(d, 2, 0) = sin(t);
    ref_matrix_vec(d, 0, 1) = -sin(t);
    ref_matrix_vec(d, 1, 1) = 0.0;
    ref_matrix_vec(d, 2, 1) = cos(t);
    ref_matrix_vec(d, 0, 2) = 0.0;
    ref_matrix_vec(d, 1, 2) = 1.0;
    ref_matrix_vec(d, 2, 2) = 0.0;
    ref_matrix_form_m(d, m);
    RSS(ref_node_metric_set(ref_node, node, m), "set node met");
  }

  return REF_SUCCESS;
}